

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::FramebufferRenderCase::init
          (FramebufferRenderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *pCVar5;
  NotSupportedError *pNVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  allocator<char> local_409;
  string local_408;
  GetNameFunc local_3e8;
  int local_3e0;
  Enum<int,_2UL> local_3d8;
  GetNameFunc local_3c8;
  int local_3c0;
  Enum<int,_2UL> local_3b8;
  GetNameFunc local_3a8;
  int local_3a0;
  Enum<int,_2UL> local_398;
  MessageBuilder local_388;
  int local_204;
  int local_200;
  GLuint type;
  GLuint format;
  GLuint internalFormat;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  FramebufferRenderCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  if (*(int *)&(this->super_RenderCase).field_0x84 == 6) {
    pCVar5 = gles3::Context::getContextInfo((this->super_RenderCase).super_TestCase.m_context);
    ctx = (EVP_PKEY_CTX *)0x2c51d0f;
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_color_buffer_half_float");
    if (!bVar1) {
      pCVar5 = gles3::Context::getContextInfo((this->super_RenderCase).super_TestCase.m_context);
      ctx = (EVP_PKEY_CTX *)0x2b85e92;
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_color_buffer_float");
      if (!bVar1) {
        local_4d = 1;
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Color renderable half float texture required.",&local_39);
        tcu::NotSupportedError::NotSupportedError(pNVar6,&local_38);
        local_4d = 0;
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  else if (*(int *)&(this->super_RenderCase).field_0x84 == 7) {
    pCVar5 = gles3::Context::getContextInfo((this->super_RenderCase).super_TestCase.m_context);
    ctx = (EVP_PKEY_CTX *)0x2b85e92;
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_color_buffer_float");
    if (!bVar1) {
      local_72 = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Color renderable float texture required.",&local_71);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_70);
      local_72 = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  RenderCase::init(&this->super_RenderCase,ctx);
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&format,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&format,(char (*) [27])"Using default framebuffer.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&format);
    iVar2 = extraout_EAX;
  }
  else {
    type = 0;
    local_200 = 0;
    local_204 = 0;
    switch(*(undefined4 *)&(this->super_RenderCase).field_0x84) {
    case 1:
      type = 0x8056;
      local_200 = 0x1908;
      local_204 = 0x8033;
      break;
    case 2:
      type = 0x8057;
      local_200 = 0x1908;
      local_204 = 0x8034;
      break;
    case 3:
      type = 0x8d62;
      local_200 = 0x1907;
      local_204 = 0x8363;
      break;
    case 4:
      type = 0x8058;
      local_200 = 0x1908;
      local_204 = 0x1401;
      break;
    case 5:
      type = 0x8059;
      local_200 = 0x1908;
      local_204 = 0x8368;
      break;
    case 6:
      type = 0x881a;
      local_200 = 0x1908;
      local_204 = 0x140b;
      break;
    case 7:
      type = 0x8814;
      local_200 = 0x1908;
      local_204 = 0x1406;
    }
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_388,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_388,(char (*) [40])"Creating fbo. Texture internalFormat = ");
    EVar9 = glu::getTextureFormatStr(type);
    local_3a8 = EVar9.m_getName;
    local_3a0 = EVar9.m_value;
    local_398.m_getName = local_3a8;
    local_398.m_value = local_3a0;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_398);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])0x2bbf208);
    EVar9 = glu::getTextureFormatStr(local_200);
    local_3c8 = EVar9.m_getName;
    local_3c0 = EVar9.m_value;
    local_3b8.m_getName = local_3c8;
    local_3b8.m_value = local_3c0;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3b8);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [10])", type = ");
    EVar9 = glu::getTypeStr(local_204);
    local_3e8 = EVar9.m_getName;
    local_3e0 = EVar9.m_value;
    local_3d8.m_getName = local_3e8;
    local_3d8.m_value = local_3e0;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3d8);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_388);
    (**(code **)(local_18 + 0x6f8))(1,&this->m_texID);
    (**(code **)(local_18 + 0xb8))(0xde1,this->m_texID);
    (**(code **)(local_18 + 0x1310))(0xde1,0,type,0x100,0x100,0,local_200,local_204,0);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"texture init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x1ce);
    (**(code **)(local_18 + 0x6d0))(1,&this->m_fboID);
    (**(code **)(local_18 + 0x78))(0x8d40,this->m_fboID);
    (**(code **)(local_18 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texID,0);
    dVar3 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar3,"fbo init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x1d4);
    iVar2 = (**(code **)(local_18 + 0x170))(0x8d40);
    if (iVar2 != 0x8cd5) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"could not create fbo for testing.",&local_409);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_408);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    iVar2 = 0x8cd5;
  }
  return iVar2;
}

Assistant:

void FramebufferRenderCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// check requirements
	if (m_fboType == FBO_RGBA_FLOAT16)
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_half_float") &&
			!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float"))
			throw tcu::NotSupportedError("Color renderable half float texture required.");
	}
	else if (m_fboType == FBO_RGBA_FLOAT32)
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float"))
			throw tcu::NotSupportedError("Color renderable float texture required.");
	}

	// gen shader
	RenderCase::init();

	// create render target
	if (m_fboType == FBO_DEFAULT)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Using default framebuffer." << tcu::TestLog::EndMessage;
	}
	else
	{
		GLuint internalFormat	= 0;
		GLuint format			= 0;
		GLuint type				= 0;

		switch (m_fboType)
		{
			case FBO_RGBA4:			internalFormat = GL_RGBA4;		format = GL_RGBA;	type = GL_UNSIGNED_SHORT_4_4_4_4;		break;
			case FBO_RGB5_A1:		internalFormat = GL_RGB5_A1;	format = GL_RGBA;	type = GL_UNSIGNED_SHORT_5_5_5_1;		break;
			case FBO_RGB565:		internalFormat = GL_RGB565;		format = GL_RGB;	type = GL_UNSIGNED_SHORT_5_6_5;			break;
			case FBO_RGBA8:			internalFormat = GL_RGBA8;		format = GL_RGBA;	type = GL_UNSIGNED_BYTE;				break;
			case FBO_RGB10_A2:		internalFormat = GL_RGB10_A2;	format = GL_RGBA;	type = GL_UNSIGNED_INT_2_10_10_10_REV;	break;
			case FBO_RGBA_FLOAT16:	internalFormat = GL_RGBA16F;	format = GL_RGBA;	type = GL_HALF_FLOAT;					break;
			case FBO_RGBA_FLOAT32:	internalFormat = GL_RGBA32F;	format = GL_RGBA;	type = GL_FLOAT;						break;

			default:
				DE_ASSERT(false);
				break;
		}

		m_testCtx.getLog() << tcu::TestLog::Message
			<< "Creating fbo. Texture internalFormat = " << glu::getTextureFormatStr(internalFormat)
			<< ", format = " << glu::getTextureFormatStr(format)
			<< ", type = " << glu::getTypeStr(type)
			<< tcu::TestLog::EndMessage;

		// gen texture
		gl.genTextures(1, &m_texID);
		gl.bindTexture(GL_TEXTURE_2D, m_texID);
		gl.texImage2D(GL_TEXTURE_2D, 0, internalFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, 0, format, type, DE_NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texture init");

		// gen fbo
		gl.genFramebuffers(1, &m_fboID);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texID, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "fbo init");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::NotSupportedError("could not create fbo for testing.");
	}
}